

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

mpack_node_data_t * mpack_node_map_int_impl(mpack_node_t node,int64_t num)

{
  int iVar1;
  mpack_node_data_t *pmVar2;
  bool bVar3;
  ulong uVar4;
  mpack_tree_t *pmVar5;
  mpack_node_data_t *pmVar6;
  mpack_node_data_t *pmVar7;
  long lVar8;
  
  pmVar5 = node.tree;
  pmVar6 = node.data;
  if (pmVar5->error == mpack_ok) {
    if (pmVar6->type == mpack_type_map) {
      if (pmVar6->len != 0) {
        lVar8 = 0x10;
        uVar4 = 0;
        pmVar7 = (mpack_node_data_t *)0x0;
        while( true ) {
          pmVar2 = (pmVar6->value).children;
          iVar1 = *(int *)((long)&pmVar2[-1].type + lVar8);
          if (((iVar1 == 3) && (*(long *)((long)pmVar2 + lVar8 + -8) == num)) ||
             ((bVar3 = true, -1 < num &&
              ((iVar1 == 4 && (*(long *)((long)pmVar2 + lVar8 + -8) == num)))))) {
            if (pmVar7 == (mpack_node_data_t *)0x0) {
              pmVar7 = (mpack_node_data_t *)((long)&pmVar2->type + lVar8);
              bVar3 = true;
            }
            else {
              if (pmVar5->error == mpack_ok) {
                pmVar5->error = mpack_error_data;
                if (pmVar5->error_fn != (mpack_tree_error_t)0x0) {
                  (*pmVar5->error_fn)(pmVar5,mpack_error_data);
                }
              }
              bVar3 = false;
            }
          }
          if (!bVar3) break;
          uVar4 = uVar4 + 1;
          lVar8 = lVar8 + 0x20;
          if (pmVar6->len <= uVar4) {
            return pmVar7;
          }
        }
      }
    }
    else {
      pmVar5->error = mpack_error_type;
      if (pmVar5->error_fn != (mpack_tree_error_t)0x0) {
        (*pmVar5->error_fn)(pmVar5,mpack_error_type);
      }
    }
  }
  return (mpack_node_data_t *)0x0;
}

Assistant:

static mpack_node_data_t* mpack_node_map_int_impl(mpack_node_t node, int64_t num) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if ((key->type == mpack_type_int && key->value.i == num) ||
            (key->type == mpack_type_uint && num >= 0 && key->value.u == (uint64_t)num))
        {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}